

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall testing::UnitTest::total_test_count(UnitTest *this)

{
  pointer ppTVar1;
  TestSuite *pTVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  ppTVar1 = (this->impl_->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar4 = (long)(this->impl_->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1;
  if (lVar4 == 0) {
    iVar3 = 0;
  }
  else {
    lVar4 = lVar4 >> 3;
    lVar5 = 0;
    iVar3 = 0;
    do {
      pTVar2 = ppTVar1[lVar5];
      iVar3 = iVar3 + (int)((ulong)((long)*(pointer *)
                                           ((long)&(pTVar2->test_info_list_).
                                                                                                      
                                                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                                  ._M_impl + 8) -
                                   *(long *)&(pTVar2->test_info_list_).
                                             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                             ._M_impl.super__Vector_impl_data) >> 3);
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  return iVar3;
}

Assistant:

int UnitTest::total_test_count() const { return impl()->total_test_count(); }